

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<soul::Identifier,_8UL>::pop_back
          (ArrayWithPreallocation<soul::Identifier,_8UL> *this)

{
  size_t sVar1;
  
  sVar1 = this->numActive;
  if (sVar1 == 1) {
    this->numActive = 0;
    if (8 < this->numAllocated) {
      if (this->items != (Identifier *)0x0) {
        operator_delete__(this->items);
      }
      this->items = (Identifier *)this->space;
      this->numAllocated = 8;
    }
  }
  else {
    if (sVar1 == 0) {
      throwInternalCompilerError("numActive > 0","pop_back",0xdd);
    }
    this->numActive = sVar1 - 1;
  }
  return;
}

Assistant:

void pop_back()
    {
        if (numActive == 1)
        {
            clear();
        }
        else
        {
            SOUL_ASSERT (numActive > 0);
            items[--numActive].~Item();
        }
    }